

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

OutlierClassification *
Catch::Benchmark::Detail::classify_outliers
          (OutlierClassification *__return_storage_ptr__,const_iterator first,const_iterator last)

{
  double dVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  reference pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double t;
  double his;
  double him;
  double lom;
  double los;
  double iqr;
  double q3;
  double q1;
  allocator<double> local_41;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_38;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> copy;
  const_iterator last_local;
  const_iterator first_local;
  
  local_40._M_current = last._M_current;
  local_38._M_current = first._M_current;
  copy.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = last._M_current;
  last_local = first;
  std::allocator<double>::allocator(&local_41);
  std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)local_30,local_38,local_40,&local_41);
  std::allocator<double>::~allocator(&local_41);
  iVar3 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_30);
  iVar4 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)local_30);
  dVar6 = weighted_average_quantile(1,4,iVar3,iVar4);
  iVar3 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_30);
  iVar4 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)local_30);
  dVar7 = weighted_average_quantile(3,4,iVar3,iVar4);
  dVar8 = dVar7 - dVar6;
  OutlierClassification::OutlierClassification(__return_storage_ptr__);
  while (bVar2 = __gnu_cxx::operator!=
                           (&last_local,
                            (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&copy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage), bVar2) {
    pdVar5 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&last_local);
    dVar1 = *pdVar5;
    if (-dVar8 * 3.0 + dVar6 <= dVar1) {
      if (-dVar8 * 1.5 + dVar6 <= dVar1) {
        if (dVar1 <= dVar8 * 3.0 + dVar7) {
          if (dVar8 * 1.5 + dVar7 < dVar1) {
            __return_storage_ptr__->high_mild = __return_storage_ptr__->high_mild + 1;
          }
        }
        else {
          __return_storage_ptr__->high_severe = __return_storage_ptr__->high_severe + 1;
        }
      }
      else {
        __return_storage_ptr__->low_mild = __return_storage_ptr__->low_mild + 1;
      }
    }
    else {
      __return_storage_ptr__->low_severe = __return_storage_ptr__->low_severe + 1;
    }
    __return_storage_ptr__->samples_seen = __return_storage_ptr__->samples_seen + 1;
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&last_local);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

OutlierClassification
            classify_outliers( std::vector<double>::const_iterator first,
                               std::vector<double>::const_iterator last ) {
                std::vector<double> copy( first, last );

                auto q1 = weighted_average_quantile( 1, 4, copy.begin(), copy.end() );
                auto q3 = weighted_average_quantile( 3, 4, copy.begin(), copy.end() );
                auto iqr = q3 - q1;
                auto los = q1 - ( iqr * 3. );
                auto lom = q1 - ( iqr * 1.5 );
                auto him = q3 + ( iqr * 1.5 );
                auto his = q3 + ( iqr * 3. );

                OutlierClassification o;
                for ( ; first != last; ++first ) {
                    const double t = *first;
                    if ( t < los ) {
                        ++o.low_severe;
                    } else if ( t < lom ) {
                        ++o.low_mild;
                    } else if ( t > his ) {
                        ++o.high_severe;
                    } else if ( t > him ) {
                        ++o.high_mild;
                    }
                    ++o.samples_seen;
                }
                return o;
            }